

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::TransactionContext::GetSizeIgnoreTxIn(TransactionContext *this,bool use_witness)

{
  bool bVar1;
  byte in_SIL;
  __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
  *in_RDI;
  TxOutReference *txout;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *__range1;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  uint32_t result;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
  local_38;
  undefined1 *local_30;
  undefined1 local_28 [24];
  uint32_t local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_10 = 10;
  if (local_9 != 0) {
    local_10 = 0xc;
  }
  cfd::core::Transaction::GetTxOutList();
  local_30 = local_28;
  local_38._M_current =
       (TxOutReference *)
       std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::begin
                 ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::end
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
    ::operator*(&local_38);
    in_stack_ffffffffffffff9c = cfd::core::AbstractTxOutReference::GetSerializeSize();
    local_10 = in_stack_ffffffffffffff9c + local_10;
    __gnu_cxx::
    __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
    ::operator++(&local_38);
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            (in_stack_ffffffffffffffb0);
  return local_10;
}

Assistant:

uint32_t TransactionContext::GetSizeIgnoreTxIn(bool use_witness) const {
  uint32_t result = AbstractTransaction::kTransactionMinimumSize;
  if (use_witness) result += 2;
  std::vector<TxOutReference> txouts = GetTxOutList();
  for (const auto& txout : txouts) {
    result += txout.GetSerializeSize();
  }
  return result;
}